

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  int iVar2;
  SumCtx *pSum;
  i64 iVal;
  ulong uVar3;
  double dVar4;
  
  if ((short)context->pMem->flags < 0) {
    pSum = (SumCtx *)context->pMem->z;
  }
  else {
    pSum = (SumCtx *)createAggContext(context,0x28);
  }
  iVar2 = sqlite3_value_numeric_type(*argv);
  if (iVar2 == 5 || pSum == (SumCtx *)0x0) {
    return;
  }
  pSum->cnt = pSum->cnt + 1;
  if (pSum->approx == '\0') {
    uVar1 = pSum->iSum;
    if (iVar2 != 1) {
      if (uVar1 + 0xfff0000000000000 < 0xffe0000000000001) {
        uVar3 = uVar1 + 0x3fff;
        if (-1 < (long)uVar1) {
          uVar3 = uVar1;
        }
        pSum->rSum = (double)(long)(uVar3 & 0xffffffffffffc000);
        dVar4 = (double)((long)uVar1 % 0x4000);
      }
      else {
        pSum->rSum = (double)(long)uVar1;
        dVar4 = 0.0;
      }
      pSum->rErr = dVar4;
      pSum->approx = '\x01';
LAB_001a09c0:
      dVar4 = sqlite3VdbeRealValue(*argv);
      kahanBabuskaNeumaierStep(pSum,dVar4);
      return;
    }
    uVar3 = sqlite3VdbeIntValue(*argv);
    if ((long)uVar3 < 0) {
      if ((-1 < (long)uVar1) || ((long)(-0x7fffffffffffffff - uVar1) <= (long)(uVar3 + 1)))
      goto LAB_001a09f8;
    }
    else if ((long)uVar1 < 1 || uVar3 <= 0x7fffffffffffffff - uVar1) {
LAB_001a09f8:
      pSum->iSum = uVar3 + uVar1;
      return;
    }
    pSum->ovrfl = '\x01';
    uVar1 = pSum->iSum;
    if (uVar1 + 0xfff0000000000000 < 0xffe0000000000001) {
      uVar3 = uVar1 + 0x3fff;
      if (-1 < (long)uVar1) {
        uVar3 = uVar1;
      }
      pSum->rSum = (double)(long)(uVar3 & 0xffffffffffffc000);
      dVar4 = (double)((long)uVar1 % 0x4000);
    }
    else {
      pSum->rSum = (double)(long)uVar1;
      dVar4 = 0.0;
    }
    pSum->rErr = dVar4;
    pSum->approx = '\x01';
  }
  else if (iVar2 != 1) {
    pSum->ovrfl = '\0';
    goto LAB_001a09c0;
  }
  iVal = sqlite3VdbeIntValue(*argv);
  kahanBabuskaNeumaierStepInt64(pSum,iVal);
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( p->approx==0 ){
      if( type!=SQLITE_INTEGER ){
        kahanBabuskaNeumaierInit(p, p->iSum);
        p->approx = 1;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }else{
        i64 x = p->iSum;
        if( sqlite3AddInt64(&x, sqlite3_value_int64(argv[0]))==0 ){
          p->iSum = x;
        }else{
          p->ovrfl = 1;
          kahanBabuskaNeumaierInit(p, p->iSum);
          p->approx = 1;
          kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
        }
      }
    }else{
      if( type==SQLITE_INTEGER ){
        kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
      }else{
        p->ovrfl = 0;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }
    }
  }
}